

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O2

bool tinyusdz::IsUSD(string *filename,string *detected_format)

{
  bool bVar1;
  
  bVar1 = IsUSDA(filename);
  if (((bVar1) || (bVar1 = IsUSDC(filename), bVar1)) || (bVar1 = IsUSDZ(filename), bVar1)) {
    if (detected_format != (string *)0x0) {
      ::std::__cxx11::string::assign((char *)detected_format);
    }
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool IsUSD(const std::string &filename, std::string *detected_format) {
  if (IsUSDA(filename)) {
    if (detected_format) {
      (*detected_format) = "usda";
    }
    return true;
  }

  if (IsUSDC(filename)) {
    if (detected_format) {
      (*detected_format) = "usdc";
    }
    return true;
  }

  if (IsUSDZ(filename)) {
    if (detected_format) {
      (*detected_format) = "usdz";
    }
    return true;
  }

  return false;
}